

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O2

void __thiscall Threadpool<Workerthread>::~Threadpool(Threadpool<Workerthread> *this)

{
  int in_ESI;
  
  if (((this->stop)._M_base._M_i & 1U) == 0) {
    exit(this,in_ESI);
  }
  std::condition_variable::~condition_variable(&this->cv_finished);
  std::condition_variable::~condition_variable(&this->cv_task);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque(&this->tasks)
  ;
  std::_Vector_base<Workerthread_*,_std::allocator<Workerthread_*>_>::~_Vector_base
            ((_Vector_base<Workerthread_*,_std::allocator<Workerthread_*>_> *)this);
  return;
}

Assistant:

~Threadpool() { if (!stop) exit(); }